

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetScrollHereX(float center_x_ratio)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  float fVar5;
  float last_item_width;
  float target_x;
  ImGuiWindow *window;
  ImGuiContext *g;
  float center_x_ratio_local;
  
  pIVar4 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  fVar1 = (pIVar3->DC).LastItemRect.Min.x;
  fVar2 = (pIVar3->Pos).x;
  fVar5 = ImRect::GetWidth(&(pIVar3->DC).LastItemRect);
  SetScrollFromPosX(fVar5 * center_x_ratio +
                    (pIVar4->Style).ItemSpacing.x * (center_x_ratio - 0.5) * 2.0 + (fVar1 - fVar2),
                    center_x_ratio);
  return;
}

Assistant:

void ImGui::SetScrollHereX(float center_x_ratio)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    float target_x = window->DC.LastItemRect.Min.x - window->Pos.x; // Left of last item, in window space
    float last_item_width = window->DC.LastItemRect.GetWidth();
    target_x += (last_item_width * center_x_ratio) + (g.Style.ItemSpacing.x * (center_x_ratio - 0.5f) * 2.0f); // Precisely aim before, in the middle or after the last item.
    SetScrollFromPosX(target_x, center_x_ratio);
}